

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O2

void aGLTextureUpdate(AGLTexture *tex,AGLTextureData *data)

{
  GLenum error;
  undefined4 uVar1;
  char *message;
  undefined8 uVar2;
  code *pcVar3;
  ulong uVar4;
  ulong local_38;
  
  if (data->type != tex->type) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x42d,"data->type == tex->type");
    aAppTerminate(-1);
  }
  uVar1 = 0x1401;
  switch(data->format) {
  case AGLTF_Unknown:
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x3d5,"!\"Unknown format\"");
    aAppTerminate(-1);
  default:
    local_38 = 0;
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x3d7,"tf.internal != 0");
    aAppTerminate(-1);
    uVar4 = 0;
    uVar1 = 0;
    break;
  case AGLTF_U8_R:
    uVar4 = 0x190900000000;
    local_38 = 0x1909;
    break;
  case AGLTF_U8_RA:
    uVar4 = 0x190a00000000;
    local_38 = 0x190a;
    break;
  case AGLTF_U8_RGBA:
    goto switchD_00103d5b_caseD_4;
  case AGLTF_U565_RGB:
    uVar1 = 0x8363;
  case AGLTF_U8_RGB:
    local_38 = 0x1907;
    uVar4 = 0x190700000000;
    break;
  case AGLTF_U5551_RGBA:
    uVar1 = 0x8034;
    goto switchD_00103d5b_caseD_4;
  case AGLTF_U4444_RGBA:
    uVar1 = 0x8033;
switchD_00103d5b_caseD_4:
    local_38 = 0x1908;
LAB_00103e1a:
    uVar4 = 0x190800000000;
    break;
  case AGLTF_F32_R:
    uVar1 = 0x1406;
    uVar4 = 0x190300000000;
    local_38 = 0x822e;
    break;
  case AGLTF_F32_RGBA:
    uVar1 = 0x1406;
    local_38 = 0x8814;
    goto LAB_00103e1a;
  }
  switch(data->type) {
  case AGLTT_NULL:
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x445,"!\"Invalid texture type\"");
    aAppTerminate(-1);
  default:
    pcVar3 = (code *)0x0;
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x447,"upload_func");
    aAppTerminate(-1);
    uVar2 = 0;
    break;
  case AGLTT_1D:
    uVar2 = 0xde0;
    pcVar3 = a__GLTexureUpload1D;
    break;
  case AGLTT_2D:
    uVar2 = 0xde1;
    pcVar3 = a__GLTexureUpload2D;
    break;
  case AGLTT_3D:
    uVar2 = 0x806f;
    goto LAB_00103ed2;
  case AGLTT_2DArray:
    uVar2 = 0x8c1a;
LAB_00103ed2:
    pcVar3 = a__GLTexureUpload3D;
  }
  glBindTexture(uVar2,(tex->_).name);
  error = glGetError();
  if (error != 0) {
    message = 
    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1098: glBindTexture(binding, tex->_.name) returned "
    ;
LAB_00103f57:
    a__GlPrintError(message,error);
    abort();
  }
  (*pcVar3)(tex,data,uVar2,uVar4 | local_38,uVar1);
  if ((data->pixels != (void *)0x0) && ((data->flags & 1) != 0)) {
    glGenerateMipmap(uVar2);
    error = glGetError();
    if (error != 0) {
      message = 
      "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1103: glGenerateMipmap(binding) returned "
      ;
      goto LAB_00103f57;
    }
  }
  tex->format = data->format;
  return;
}

Assistant:

void aGLTextureUpdate(AGLTexture *tex, const AGLTextureData *data) {
	ATTO_ASSERT(data->type == tex->type);

	struct A__GLTextureFormat tf = getTextureFormat(data->format);

	a__gl_texture_upload_func *upload_func = NULL;
	GLenum binding = 0;

	switch (data->type) {
		case AGLTT_1D:
			upload_func = &a__GLTexureUpload1D;
			binding = GL_TEXTURE_1D;
			break;
		case AGLTT_2D:
			upload_func = &a__GLTexureUpload2D;
			binding = GL_TEXTURE_2D;
			break;
		case AGLTT_3D:
			upload_func = &a__GLTexureUpload3D;
			binding = GL_TEXTURE_3D;
			break;
		case AGLTT_2DArray:
			upload_func = &a__GLTexureUpload3D;
			binding = GL_TEXTURE_2D_ARRAY;
			break;
		case AGLTT_NULL: ATTO_ASSERT(!"Invalid texture type");
	}
	ATTO_ASSERT(upload_func);

	// TODO track bindings properly
	AGL__CALL(glBindTexture(binding, tex->_.name));

	upload_func(tex, data, binding, tf);

	if (data->pixels && (data->flags & AGLTUF_GenerateMipmaps))
		AGL__CALL(glGenerateMipmap(binding));

	tex->format = data->format;
}